

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

void printBounds(Settings *s)

{
  ostream *poVar1;
  void *this;
  Settings *s_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Bounds:\n\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->minx);
  poVar1 = std::operator<<(poVar1," <= x <= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->maxx);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->miny);
  poVar1 = std::operator<<(poVar1," <= y <= ");
  this = (void *)std::ostream::operator<<(poVar1,s->maxy);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printBounds(const Settings& s)
{
	std::cout << "Bounds:\n\t"
			<< s.minx << " <= x <= " << s.maxx
			<< "\n\t"
			<< s.miny << " <= y <= " << s.maxy
			<< std::endl;
}